

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O1

void __thiscall
MultiAgentDecisionProcess::SetNrAgents(MultiAgentDecisionProcess *this,size_t nrAgents)

{
  pointer pAVar1;
  pointer pAVar2;
  iterator __position;
  uint uVar3;
  pointer pAVar4;
  bool bVar5;
  ulong local_f0;
  string local_e0;
  string local_c0;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_a0;
  _func_int **local_98;
  _func_int **local_90;
  vector<Agent,_std::allocator<Agent>_> *local_88;
  Agent local_80;
  
  this->_m_nrAgents = nrAgents;
  pAVar1 = (this->_m_agents).super__Vector_base<Agent,_std::allocator<Agent>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar2 = (this->_m_agents).super__Vector_base<Agent,_std::allocator<Agent>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pAVar4 = pAVar1;
  if (pAVar2 != pAVar1) {
    do {
      (**(pAVar4->super_NamedDescribedEntity)._vptr_NamedDescribedEntity)(pAVar4);
      pAVar4 = pAVar4 + 1;
    } while (pAVar4 != pAVar2);
    (this->_m_agents).super__Vector_base<Agent,_std::allocator<Agent>_>._M_impl.
    super__Vector_impl_data._M_finish = pAVar1;
  }
  if (nrAgents != 0) {
    local_88 = &this->_m_agents;
    local_a0 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->_m_allAgentsScope;
    local_f0 = 1;
    local_98 = (_func_int **)&PTR__Agent_005d03a8;
    local_90 = (_func_int **)&PTR__Agent_005d03d8;
    do {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"undefined","");
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"undefined","");
      NamedDescribedEntity::NamedDescribedEntity
                (&local_80.super_NamedDescribedEntity,&local_c0,&local_e0);
      uVar3 = (int)local_f0 - 1;
      local_80.super_NamedDescribedEntity._vptr_NamedDescribedEntity = local_98;
      local_80.super_DiscreteEntity._vptr_DiscreteEntity = local_90;
      local_80.super_DiscreteEntity._m_index = uVar3;
      std::vector<Agent,_std::allocator<Agent>_>::emplace_back<Agent>(local_88,&local_80);
      NamedDescribedEntity::~NamedDescribedEntity(&local_80.super_NamedDescribedEntity);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      local_80.super_NamedDescribedEntity._vptr_NamedDescribedEntity =
           (_func_int **)
           CONCAT44(local_80.super_NamedDescribedEntity._vptr_NamedDescribedEntity._4_4_,uVar3);
      __position._M_current =
           (this->_m_allAgentsScope).super_SDT.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_m_allAgentsScope).super_SDT.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_a0,__position,(uint *)&local_80);
      }
      else {
        *__position._M_current = uVar3;
        (this->_m_allAgentsScope).super_SDT.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      bVar5 = local_f0 < nrAgents;
      local_f0 = (ulong)((int)local_f0 + 1);
    } while (bVar5);
  }
  return;
}

Assistant:

void MultiAgentDecisionProcess::SetNrAgents(size_t nrAgents) 
{
    _m_nrAgents = nrAgents;
    _m_agents.clear();
    for(Index i = 0; i < nrAgents; i++)
    {
        _m_agents.push_back(Agent(i));
        _m_allAgentsScope.Insert(i);
    }
}